

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorykeyvaluestore.cpp
# Opt level: O2

Set __thiscall
groundupdbext::MemoryKeyValueStore::getKeyValueSet(MemoryKeyValueStore *this,HashedValue *key)

{
  iterator iVar1;
  key_type *in_RDX;
  
  iVar1 = std::
          _Hashtable<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_std::allocator<std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_std::allocator<std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(*(long *)&key->m_has_value + 0x80),in_RDX);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    if (*(char *)(*(long *)&key->m_has_value + 0x108) == '\x01') {
      (**(code **)(**(long **)(*(long *)&key->m_has_value + 0x100) + 0x28))(this);
    }
    else {
      std::
      make_unique<std::unordered_set<groundupdb::EncodedValue,std::hash<groundupdb::EncodedValue>,std::equal_to<groundupdb::EncodedValue>,std::allocator<groundupdb::EncodedValue>>>
                ();
    }
  }
  else {
    std::
    make_unique<std::unordered_set<groundupdb::EncodedValue,std::hash<groundupdb::EncodedValue>,std::equal_to<groundupdb::EncodedValue>,std::allocator<groundupdb::EncodedValue>>,std::unordered_set<groundupdb::EncodedValue,std::hash<groundupdb::EncodedValue>,std::equal_to<groundupdb::EncodedValue>,std::allocator<groundupdb::EncodedValue>>&>
              ((unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>
                *)this);
  }
  return (__uniq_ptr_data<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>,_true,_true>
          )(__uniq_ptr_data<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>,_true,_true>
            )this;
}

Assistant:

Set
MemoryKeyValueStore::getKeyValueSet(const HashedValue& key) {
  const auto& v = mImpl->m_listStore.find(key);
  //std::cout << "MEMKVS: getKeyValueSet" << std::endl;
  if (v == mImpl->m_listStore.end()) {
    //std::cout << "  MEMKVS: not found in memory" << std::endl;
    // try underlying store first
    if (mImpl->m_cachedStore) {
      //std::cout << "  MEMKVS: checking underlying store we're caching for and returning" << std::endl;
      return mImpl->m_cachedStore->get()->getKeyValueSet(key);
    }
    //std::cout << "  MEMKVS: Returning empty value" << std::endl;
    return std::make_unique<std::unordered_set<EncodedValue>>(); // copy ctor
  }
  //std::cout << "  MEMKVS: returning Set with size: " << v->second->size() << std::endl;
  // Note we dereference the below because v->second is an unorderedmap hashedvalue wrapper, and not the Set value itself
  return std::make_unique<std::unordered_set<EncodedValue>>(*(v->second)); // copy ctor
}